

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O2

int Abc_NtkTestScorrWriteEquivGia(Tst_Dat_t *pData)

{
  Abc_Ntk_t *pNetlist;
  Gia_Man_t *p;
  Vec_Int_t *vId2Name;
  int iVar1;
  int iVar2;
  FILE *__stream;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  uint uVar3;
  char *pName;
  long lVar4;
  uint local_54;
  
  pNetlist = pData->pNetlist;
  p = pData->pGia;
  vId2Name = pData->vId2Name;
  pName = pData->pFileNameOut;
  if (pData->fDumpBmc != 0) {
    pData->fDumpBmc = 0;
    Abc_NtkBmcFileName(pName);
    pName = Abc_NtkBmcFileName::Buffer;
  }
  __stream = fopen(pName,"wb");
  Gia_ManSetPhase(p);
  local_54 = 0;
  for (lVar4 = 0; lVar4 < p->nObjs; lVar4 = lVar4 + 1) {
    iVar2 = (int)lVar4;
    pObj = Gia_ManObj(p,iVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)p->pReprs[lVar4] & 0xfffffff;
    if (uVar3 != 0xfffffff) {
      pObj_00 = Gia_ManObj(p,uVar3);
      if (pData->fFlopOnly == 0) {
        if ((pData->fFfNdOnly != 0) && (iVar1 = Gia_ObjIsRo(p,pObj), iVar1 == 0)) goto LAB_002bf9d6;
LAB_002bfa12:
        uVar3 = (uint)p->pReprs[lVar4] & 0xfffffff;
        if (uVar3 == 0) {
          iVar2 = Abc_NtkTestScorrWriteEquivConst
                            (pNetlist,vId2Name,iVar2,(FILE *)__stream,
                             (uint)((ulong)*(undefined8 *)pObj >> 0x3f));
        }
        else {
          iVar2 = Abc_NtkTestScorrWriteEquivPair
                            (pNetlist,vId2Name,uVar3,iVar2,(FILE *)__stream,
                             ((uint)((ulong)*(undefined8 *)pObj >> 0x20) ^
                             (uint)((ulong)*(undefined8 *)pObj_00 >> 0x20)) >> 0x1f);
        }
        local_54 = local_54 + iVar2;
      }
      else {
        iVar1 = Gia_ObjIsRo(p,pObj);
        if (iVar1 != 0) {
LAB_002bf9d6:
          iVar1 = Gia_ObjIsRo(p,pObj_00);
          if ((iVar1 != 0) || ((~*(ulong *)pObj_00 & 0x1fffffff1fffffff) == 0)) goto LAB_002bfa12;
        }
      }
    }
  }
  fclose(__stream);
  printf("%d pairs of sequentially equivalent nodes are written into file \"%s\".\n",(ulong)local_54
         ,pName);
  return local_54;
}

Assistant:

int Abc_NtkTestScorrWriteEquivGia( Tst_Dat_t * pData )
{
    Abc_Ntk_t * pNetlist = pData->pNetlist;
    Vec_Int_t * vId2Name = pData->vId2Name;
    Gia_Man_t * pGia     = pData->pGia;
    char * pFileNameOut  = pData->pFileNameOut;
    FILE * pFile;
    Gia_Obj_t * pObj, * pRepr;
    int i, Counter = 0;
    if ( pData->fDumpBmc )
    {
        pData->fDumpBmc = 0;
        pFileNameOut = Abc_NtkBmcFileName( pFileNameOut );
    }
    pFile = fopen( pFileNameOut, "wb" );
    Gia_ManSetPhase( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !Gia_ObjHasRepr(pGia, i) )
            continue;
        pRepr = Gia_ManObj( pGia,Gia_ObjRepr(pGia, i) );
        if ( pData->fFlopOnly )
        {
            if ( !Gia_ObjIsRo(pGia, pObj) || !(Gia_ObjIsRo(pGia, pRepr)||Gia_ObjIsConst0(pRepr)) )
                continue;
        }
        else if ( pData->fFfNdOnly )
        {
            if ( !Gia_ObjIsRo(pGia, pObj) && !(Gia_ObjIsRo(pGia, pRepr)||Gia_ObjIsConst0(pRepr)) )
                continue;
        }
        if ( Gia_ObjRepr(pGia, i) == 0 )
            Counter += Abc_NtkTestScorrWriteEquivConst( pNetlist, vId2Name, i, pFile, Gia_ObjPhase(pObj) );
        else
            Counter += Abc_NtkTestScorrWriteEquivPair( pNetlist, vId2Name, Gia_ObjRepr(pGia, i), i, pFile, 
                Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
    }
    fclose( pFile );
    printf( "%d pairs of sequentially equivalent nodes are written into file \"%s\".\n", Counter, pFileNameOut );
    return Counter;
}